

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

void dumpFilename(Symbol *sym)

{
  Symbol *sym_local;
  
  if (sym->src == (FileStackNode *)0x0) {
    if (sym->fileLine == 0) {
      fputs("<command-line>",_stderr);
    }
    else {
      fputs("<builtin>",_stderr);
    }
  }
  else {
    fstk_Dump(sym->src,sym->fileLine);
  }
  return;
}

Assistant:

static void dumpFilename(struct Symbol const *sym)
{
	if (sym->src)
		fstk_Dump(sym->src, sym->fileLine);
	else if (sym->fileLine == 0)
		fputs("<command-line>", stderr);
	else
		fputs("<builtin>", stderr);
}